

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.h
# Opt level: O0

void __thiscall
sigslot::
signal1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
::operator()(signal1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
             *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a1)

{
  _connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
  *p_Var1;
  bool bVar2;
  reference pp_Var3;
  string local_68 [32];
  iterator local_48;
  _List_const_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
  local_40;
  const_iterator itEnd;
  _List_const_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
  local_30;
  const_iterator it;
  const_iterator itNext;
  lock_block<sigslot::multi_threaded_local> lock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a1_local;
  signal1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
  *this_local;
  
  lock_block<sigslot::multi_threaded_local>::lock_block
            ((lock_block<sigslot::multi_threaded_local> *)&itNext,(multi_threaded_local *)this);
  std::
  _List_const_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
  ::_List_const_iterator(&it);
  itEnd._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
       ::begin(&(this->
                super__signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
                ).m_connected_slots);
  std::
  _List_const_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
  ::_List_const_iterator(&local_30,(iterator *)&itEnd);
  local_48._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
       ::end(&(this->
              super__signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
              ).m_connected_slots);
  std::
  _List_const_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
  ::_List_const_iterator(&local_40,&local_48);
  while( true ) {
    bVar2 = std::operator!=(&local_30,&local_40);
    if (!bVar2) break;
    it._M_node = local_30._M_node;
    std::
    _List_const_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
    ::operator++(&it);
    pp_Var3 = std::
              _List_const_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
              ::operator*(&local_30);
    p_Var1 = *pp_Var3;
    std::__cxx11::string::string(local_68,(string *)a1);
    (**(code **)(*(long *)p_Var1 + 0x18))(p_Var1,local_68);
    std::__cxx11::string::~string(local_68);
    local_30._M_node = it._M_node;
  }
  lock_block<sigslot::multi_threaded_local>::~lock_block
            ((lock_block<sigslot::multi_threaded_local> *)&itNext);
  return;
}

Assistant:

void operator()(arg1_type a1)
		{
			lock_block<mt_policy> lock(this);
			const_iterator itNext, it = this->m_connected_slots.begin();
			const_iterator itEnd = this->m_connected_slots.end();

			while(it != itEnd)
			{
				itNext = it;
				++itNext;

				(*it)->emit(a1);

				it = itNext;
			}
		}